

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O2

ErrorCode __thiscall
ComponentManager::CreateInstance(ComponentManager *this,CID cid,IID iid,void **object)

{
  int iVar1;
  ErrorCode EVar2;
  IFactory *factory;
  
  iVar1 = (*(this->super_IComponentManager).super_ISupports._vptr_ISupports[10])
                    (this,cid.mId,"IFactory",&factory);
  if (iVar1 == 0) {
    EVar2 = (**(code **)(*(long *)factory + 0x28))(factory,cid.mId,iid.mId,object);
    (**(code **)(*(long *)factory + 8))();
  }
  else {
    EVar2 = kNoFactory;
  }
  return EVar2;
}

Assistant:

ErrorCode ComponentManager::CreateInstance( CID cid, IID iid, void **object )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	ErrorCode result = kNoError;	
	IFactory *factory;
	
	result = GetService( cid, IFactory::getIID(), (void**)&factory );
	
	LOG( "GetService result %d", result );
	
	if ( result == kNoError )
	{
		result = factory->CreateInstance( cid, iid, object );
		factory->Release();
	}
	else
		result = kNoFactory;

	return result;	
}